

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O2

void show_breadcrumb(char *name,void *memo_ptr)

{
  int iVar1;
  
  iVar1 = *(int *)((long)memo_ptr + 0x10);
  if (1 < iVar1) {
    (**memo_ptr)("-> ");
    iVar1 = *(int *)((long)memo_ptr + 0x10);
  }
  if (0 < iVar1) {
    (**memo_ptr)("%s ",name);
    iVar1 = *(int *)((long)memo_ptr + 0x10);
  }
  *(int *)((long)memo_ptr + 0x10) = iVar1 + 1;
  return;
}

Assistant:

static void show_breadcrumb(const char *name, void *memo_ptr) {
    TextMemo *memo = (TextMemo *)memo_ptr;
    if (memo->depth > 1) {
        memo->printer("-> ");
    }
    if (memo->depth > 0) {
        memo->printer("%s ", name);
    }
    memo->depth++;
}